

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_types.cpp
# Opt level: O0

void __thiscall Clasp::SmallClauseAlloc::allocBlock(SmallClauseAlloc *this)

{
  undefined8 *puVar1;
  undefined8 *in_RDI;
  uint32 i;
  Block *r;
  uint local_14;
  
  puVar1 = (undefined8 *)operator_new(0x8000);
  for (local_14 = 0; local_14 < 0x3fe; local_14 = local_14 + 1) {
    puVar1[(ulong)local_14 * 4 + 4] = puVar1 + (ulong)(local_14 + 1) * 4 + 4;
  }
  puVar1[0xffc] = in_RDI[1];
  in_RDI[1] = puVar1 + 4;
  *puVar1 = *in_RDI;
  *in_RDI = puVar1;
  return;
}

Assistant:

void SmallClauseAlloc::allocBlock() {
	Block* r = (Block*)::operator new(sizeof(Block));
	for (uint32 i = 0; i < Block::num_chunks-1; ++i) {
		r->chunk[i].next = &r->chunk[i+1];
	}
	r->chunk[Block::num_chunks-1].next = freeList_;
	freeList_ = r->chunk;
	r->next   = blocks_;
	blocks_   = r;
}